

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O0

void Imf_2_5::anon_unknown_9::csc709Inverse(float *comp0,float *comp1,float *comp2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float src [3];
  float *comp2_local;
  float *comp1_local;
  float *comp0_local;
  
  fVar1 = *comp0;
  fVar2 = *comp1;
  fVar3 = *comp2;
  *comp0 = fVar3 * 1.5747 + fVar1;
  *comp1 = fVar3 * -0.4682 + fVar2 * -0.1873 + fVar1;
  *comp2 = fVar2 * 1.8556 + fVar1;
  return;
}

Assistant:

void
csc709Inverse (float &comp0, float &comp1, float &comp2)
{
    float src[3];

    src[0] = comp0;
    src[1] = comp1;
    src[2] = comp2;

    comp0 = src[0]                    + 1.5747f * src[2];
    comp1 = src[0] - 0.1873f * src[1] - 0.4682f * src[2];
    comp2 = src[0] + 1.8556f * src[1];
}